

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

bool __thiscall FlowGraph::UnsignedCmpPeep(FlowGraph *this,Instr *cmpInstr)

{
  ByteCodeUsesInstr *src1Opnd;
  bool bVar1;
  IRType IVar2;
  BranchInstr *this_00;
  Opnd *pOVar3;
  ByteCodeUsesInstr *this_01;
  RegOpnd *pRVar4;
  IntConstOpnd *pIVar5;
  Instr *pIVar6;
  Instr *orZero_1;
  RegOpnd *unsignedSrc_1;
  Instr *orZero;
  RegOpnd *unsignedSrc;
  ByteCodeUsesInstr *bytecodeInstr;
  Opnd *newSrc2;
  Opnd *newSrc1;
  Opnd *cmpSrc2;
  Opnd *cmpSrc1;
  Instr *cmpInstr_local;
  FlowGraph *this_local;
  
  cmpSrc1 = (Opnd *)cmpInstr;
  cmpInstr_local = (Instr *)this;
  cmpSrc2 = IR::Instr::GetSrc1(cmpInstr);
  newSrc1 = IR::Instr::GetSrc2((Instr *)cmpSrc1);
  bVar1 = Func::DoGlobOpt(this->func);
  if (((bVar1) && (bVar1 = GlobOpt::DoAggressiveIntTypeSpec(this->func), bVar1)) &&
     (bVar1 = GlobOpt::DoLossyIntTypeSpec(this->func), bVar1)) {
    bVar1 = IR::Instr::IsBranchInstr((Instr *)cmpSrc1);
    if (bVar1) {
      this_00 = IR::Instr::AsBranchInstr((Instr *)cmpSrc1);
      bVar1 = IR::BranchInstr::IsConditional(this_00);
      if (!bVar1) {
        return false;
      }
    }
    pOVar3 = IR::Instr::GetSrc2((Instr *)cmpSrc1);
    if (pOVar3 == (Opnd *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = IsUnsignedOpnd(this,cmpSrc2,&newSrc2);
      if (bVar1) {
        bVar1 = IsUnsignedOpnd(this,newSrc1,(Opnd **)&bytecodeInstr);
        if (bVar1) {
          switch(*(int *)&cmpSrc1[3]._vptr_Opnd - 0xcU & 0xffff) {
          case 0:
          case 1:
          case 8:
          case 9:
          case 0x2f:
          case 0x34:
          case 0x35:
          case 0x36:
            break;
          default:
            return false;
          case 4:
            *(undefined2 *)&cmpSrc1[3]._vptr_Opnd = 0x18e;
            break;
          case 5:
            *(undefined2 *)&cmpSrc1[3]._vptr_Opnd = 399;
            break;
          case 6:
            *(undefined2 *)&cmpSrc1[3]._vptr_Opnd = 400;
            break;
          case 7:
            *(undefined2 *)&cmpSrc1[3]._vptr_Opnd = 0x191;
            break;
          case 0x30:
            *(undefined2 *)&cmpSrc1[3]._vptr_Opnd = 0x1cf;
            break;
          case 0x31:
            *(undefined2 *)&cmpSrc1[3]._vptr_Opnd = 0x1d0;
            break;
          case 0x32:
            *(undefined2 *)&cmpSrc1[3]._vptr_Opnd = 0x1d1;
            break;
          case 0x33:
            *(undefined2 *)&cmpSrc1[3]._vptr_Opnd = 0x1d2;
          }
          this_01 = IR::ByteCodeUsesInstr::New((Instr *)cmpSrc1);
          if (cmpSrc2 != newSrc2) {
            bVar1 = IR::Opnd::IsRegOpnd(cmpSrc2);
            if ((bVar1) && (bVar1 = IR::Opnd::GetIsJITOptimizedReg(cmpSrc2), !bVar1)) {
              IR::ByteCodeUsesInstr::Set(this_01,cmpSrc2);
            }
            IVar2 = IR::Opnd::GetType(newSrc2);
            pRVar4 = IR::RegOpnd::New(IVar2,(Func *)cmpSrc1[2]._vptr_Opnd);
            pOVar3 = newSrc2;
            pIVar5 = IR::IntConstOpnd::New(0,TyInt64,(Func *)cmpSrc1[2]._vptr_Opnd,false);
            pIVar6 = IR::Instr::New(Or_A,&pRVar4->super_Opnd,pOVar3,&pIVar5->super_Opnd,
                                    (Func *)cmpSrc1[2]._vptr_Opnd);
            IR::Instr::SetByteCodeOffset(pIVar6,(Instr *)cmpSrc1);
            IR::Instr::InsertBefore((Instr *)cmpSrc1,pIVar6);
            IR::Instr::ReplaceSrc1((Instr *)cmpSrc1,&pRVar4->super_Opnd);
            bVar1 = IR::Opnd::IsRegOpnd(newSrc2);
            if (bVar1) {
              pOVar3 = IR::Instr::GetSrc1((Instr *)cmpSrc1);
              pRVar4 = IR::Opnd::AsRegOpnd(pOVar3);
              IR::Opnd::SetIsJITOptimizedReg(&pRVar4->super_Opnd,true);
              pOVar3 = IR::Instr::GetSrc1(pIVar6);
              IR::Opnd::SetIsJITOptimizedReg(pOVar3,true);
            }
          }
          if ((ByteCodeUsesInstr *)newSrc1 != bytecodeInstr) {
            bVar1 = IR::Opnd::IsRegOpnd(newSrc1);
            if ((bVar1) && (bVar1 = IR::Opnd::GetIsJITOptimizedReg(newSrc1), !bVar1)) {
              IR::ByteCodeUsesInstr::Set(this_01,newSrc1);
            }
            IVar2 = IR::Opnd::GetType((Opnd *)bytecodeInstr);
            pRVar4 = IR::RegOpnd::New(IVar2,(Func *)cmpSrc1[2]._vptr_Opnd);
            src1Opnd = bytecodeInstr;
            pIVar5 = IR::IntConstOpnd::New(0,TyInt64,(Func *)cmpSrc1[2]._vptr_Opnd,false);
            pIVar6 = IR::Instr::New(Or_A,&pRVar4->super_Opnd,(Opnd *)src1Opnd,&pIVar5->super_Opnd,
                                    (Func *)cmpSrc1[2]._vptr_Opnd);
            IR::Instr::SetByteCodeOffset(pIVar6,(Instr *)cmpSrc1);
            IR::Instr::InsertBefore((Instr *)cmpSrc1,pIVar6);
            IR::Instr::ReplaceSrc2((Instr *)cmpSrc1,&pRVar4->super_Opnd);
            bVar1 = IR::Opnd::IsRegOpnd((Opnd *)bytecodeInstr);
            if (bVar1) {
              pOVar3 = IR::Instr::GetSrc2((Instr *)cmpSrc1);
              pRVar4 = IR::Opnd::AsRegOpnd(pOVar3);
              IR::Opnd::SetIsJITOptimizedReg(&pRVar4->super_Opnd,true);
              pOVar3 = IR::Instr::GetSrc1(pIVar6);
              IR::Opnd::SetIsJITOptimizedReg(pOVar3,true);
            }
          }
          IR::Instr::InsertBefore((Instr *)cmpSrc1,&this_01->super_Instr);
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FlowGraph::UnsignedCmpPeep(IR::Instr *cmpInstr)
{
    IR::Opnd *cmpSrc1 = cmpInstr->GetSrc1();
    IR::Opnd *cmpSrc2 = cmpInstr->GetSrc2();
    IR::Opnd *newSrc1;
    IR::Opnd *newSrc2;

    // Look for something like:
    //  t1 = ShrU_A x, 0
    //  t2 = 10;
    //  BrGt t1, t2, L
    //
    // Peep to:
    //
    //  t1 = ShrU_A x, 0
    //  t2 = 10;
    //  t3 = Or_A x, 0
    //  BrUnGt x, t3, L
    //       ByteCodeUse t1
    //
    // Hopefully dead-store can get rid of the ShrU

    if (!this->func->DoGlobOpt() || !GlobOpt::DoAggressiveIntTypeSpec(this->func) || !GlobOpt::DoLossyIntTypeSpec(this->func))
    {
        return false;
    }

    if (cmpInstr->IsBranchInstr() && !cmpInstr->AsBranchInstr()->IsConditional())
    {
        return false;
    }

    if (!cmpInstr->GetSrc2())
    {
        return false;
    }

    if (!this->IsUnsignedOpnd(cmpSrc1, &newSrc1))
    {
        return false;
    }
    if (!this->IsUnsignedOpnd(cmpSrc2, &newSrc2))
    {
        return false;
    }

    switch(cmpInstr->m_opcode)
    {
    case Js::OpCode::BrEq_A:
    case Js::OpCode::BrNeq_A:
    case Js::OpCode::BrSrEq_A:
    case Js::OpCode::BrSrNeq_A:
    case Js::OpCode::CmEq_A:
    case Js::OpCode::CmNeq_A:
    case Js::OpCode::CmSrEq_A:
    case Js::OpCode::CmSrNeq_A:
        break;
    case Js::OpCode::BrLe_A:
        cmpInstr->m_opcode = Js::OpCode::BrUnLe_A;
        break;
    case Js::OpCode::BrLt_A:
        cmpInstr->m_opcode = Js::OpCode::BrUnLt_A;
        break;
    case Js::OpCode::BrGe_A:
        cmpInstr->m_opcode = Js::OpCode::BrUnGe_A;
        break;
    case Js::OpCode::BrGt_A:
        cmpInstr->m_opcode = Js::OpCode::BrUnGt_A;
        break;
    case Js::OpCode::CmLe_A:
        cmpInstr->m_opcode = Js::OpCode::CmUnLe_A;
        break;
    case Js::OpCode::CmLt_A:
        cmpInstr->m_opcode = Js::OpCode::CmUnLt_A;
        break;
    case Js::OpCode::CmGe_A:
        cmpInstr->m_opcode = Js::OpCode::CmUnGe_A;
        break;
    case Js::OpCode::CmGt_A:
        cmpInstr->m_opcode = Js::OpCode::CmUnGt_A;
        break;

    default:
        return false;
    }

    IR::ByteCodeUsesInstr * bytecodeInstr = IR::ByteCodeUsesInstr::New(cmpInstr);

    if (cmpSrc1 != newSrc1)
    {
        if (cmpSrc1->IsRegOpnd() && !cmpSrc1->GetIsJITOptimizedReg())
        {
            bytecodeInstr->Set(cmpSrc1);
        }

        IR::RegOpnd * unsignedSrc = IR::RegOpnd::New(newSrc1->GetType(), cmpInstr->m_func);
        IR::Instr * orZero = IR::Instr::New(Js::OpCode::Or_A, unsignedSrc, newSrc1, IR::IntConstOpnd::New(0, TyMachReg, cmpInstr->m_func), cmpInstr->m_func);
        orZero->SetByteCodeOffset(cmpInstr);
        cmpInstr->InsertBefore(orZero);
        cmpInstr->ReplaceSrc1(unsignedSrc);
        if (newSrc1->IsRegOpnd())
        {
            cmpInstr->GetSrc1()->AsRegOpnd()->SetIsJITOptimizedReg(true);
            orZero->GetSrc1()->SetIsJITOptimizedReg(true);
        }
    }
    if (cmpSrc2 != newSrc2)
    {
        if (cmpSrc2->IsRegOpnd() && !cmpSrc2->GetIsJITOptimizedReg())
        {
            bytecodeInstr->Set(cmpSrc2);
        }

        IR::RegOpnd * unsignedSrc = IR::RegOpnd::New(newSrc2->GetType(), cmpInstr->m_func);
        IR::Instr * orZero = IR::Instr::New(Js::OpCode::Or_A, unsignedSrc, newSrc2, IR::IntConstOpnd::New(0, TyMachReg, cmpInstr->m_func), cmpInstr->m_func);
        orZero->SetByteCodeOffset(cmpInstr);
        cmpInstr->InsertBefore(orZero);
        cmpInstr->ReplaceSrc2(unsignedSrc);
        if (newSrc2->IsRegOpnd())
        {
            cmpInstr->GetSrc2()->AsRegOpnd()->SetIsJITOptimizedReg(true);
            orZero->GetSrc1()->SetIsJITOptimizedReg(true);
        }
    }

    cmpInstr->InsertBefore(bytecodeInstr);
    return true;
}